

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

void cvFreeVectors(CVodeMem cv_mem)

{
  int iVar1;
  long lVar2;
  
  iVar1 = cv_mem->cv_qmax_alloc;
  N_VDestroy(cv_mem->cv_ewt);
  N_VDestroy(cv_mem->cv_acor);
  N_VDestroy(cv_mem->cv_tempv);
  N_VDestroy(cv_mem->cv_ftemp);
  N_VDestroy(cv_mem->cv_vtemp1);
  N_VDestroy(cv_mem->cv_vtemp2);
  N_VDestroy(cv_mem->cv_vtemp3);
  for (lVar2 = 0; lVar2 <= iVar1; lVar2 = lVar2 + 1) {
    N_VDestroy(cv_mem->cv_zn[lVar2]);
  }
  lVar2 = (long)(iVar1 + 8);
  cv_mem->cv_lrw = cv_mem->cv_lrw - cv_mem->cv_lrw1 * lVar2;
  cv_mem->cv_liw = cv_mem->cv_liw - lVar2 * cv_mem->cv_liw1;
  if (cv_mem->cv_VabstolMallocDone != 0) {
    N_VDestroy(cv_mem->cv_Vabstol);
    cv_mem->cv_lrw = cv_mem->cv_lrw - cv_mem->cv_lrw1;
    cv_mem->cv_liw = cv_mem->cv_liw - cv_mem->cv_liw1;
  }
  if (cv_mem->cv_constraintsMallocDone != 0) {
    N_VDestroy(cv_mem->cv_constraints);
    cv_mem->cv_lrw = cv_mem->cv_lrw - cv_mem->cv_lrw1;
    cv_mem->cv_liw = cv_mem->cv_liw - cv_mem->cv_liw1;
  }
  return;
}

Assistant:

static void cvFreeVectors(CVodeMem cv_mem)
{
  int j, maxord;

  maxord = cv_mem->cv_qmax_alloc;

  N_VDestroy(cv_mem->cv_ewt);
  N_VDestroy(cv_mem->cv_acor);
  N_VDestroy(cv_mem->cv_tempv);
  N_VDestroy(cv_mem->cv_ftemp);
  N_VDestroy(cv_mem->cv_vtemp1);
  N_VDestroy(cv_mem->cv_vtemp2);
  N_VDestroy(cv_mem->cv_vtemp3);
  for (j = 0; j <= maxord; j++) { N_VDestroy(cv_mem->cv_zn[j]); }

  cv_mem->cv_lrw -= (maxord + 8) * cv_mem->cv_lrw1;
  cv_mem->cv_liw -= (maxord + 8) * cv_mem->cv_liw1;

  if (cv_mem->cv_VabstolMallocDone)
  {
    N_VDestroy(cv_mem->cv_Vabstol);
    cv_mem->cv_lrw -= cv_mem->cv_lrw1;
    cv_mem->cv_liw -= cv_mem->cv_liw1;
  }

  if (cv_mem->cv_constraintsMallocDone)
  {
    N_VDestroy(cv_mem->cv_constraints);
    cv_mem->cv_lrw -= cv_mem->cv_lrw1;
    cv_mem->cv_liw -= cv_mem->cv_liw1;
  }
}